

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O3

void pdf_set_obj_parent(hd_context *ctx,pdf_obj *obj,int num)

{
  int iVar1;
  pdf_obj *ppVar2;
  int iVar3;
  
  if ((pdf_obj *)0x188 < obj) {
    if (obj->kind == 'd') {
      obj[4].refs = (short)num;
      obj[4].kind = (char)((uint)num >> 0x10);
      obj[4].flags = (char)((uint)num >> 0x18);
      iVar1 = pdf_dict_len(ctx,obj);
      if (0 < iVar1) {
        iVar3 = 0;
        do {
          ppVar2 = pdf_dict_get_val(ctx,obj,iVar3);
          pdf_set_obj_parent(ctx,ppVar2,num);
          iVar3 = iVar3 + 1;
        } while (iVar1 != iVar3);
      }
    }
    else if (obj->kind == 'a') {
      obj[4].refs = (short)num;
      obj[4].kind = (char)((uint)num >> 0x10);
      obj[4].flags = (char)((uint)num >> 0x18);
      iVar1 = pdf_array_len(ctx,obj);
      if (0 < iVar1) {
        iVar3 = 0;
        do {
          ppVar2 = pdf_array_get(ctx,obj,iVar3);
          pdf_set_obj_parent(ctx,ppVar2,num);
          iVar3 = iVar3 + 1;
        } while (iVar1 != iVar3);
      }
    }
  }
  return;
}

Assistant:

void
pdf_set_obj_parent(hd_context *ctx, pdf_obj *obj, int num)
{
    int n, i;

    if (obj < PDF_OBJ__LIMIT)
        return;

    switch(obj->kind)
    {
        case PDF_ARRAY:
            ARRAY(obj)->parent_num = num;
            n = pdf_array_len(ctx, obj);
            for (i = 0; i < n; i++)
                pdf_set_obj_parent(ctx, pdf_array_get(ctx, obj, i), num);
            break;
        case PDF_DICT:
            DICT(obj)->parent_num = num;
            n = pdf_dict_len(ctx, obj);
            for (i = 0; i < n; i++)
                pdf_set_obj_parent(ctx, pdf_dict_get_val(ctx, obj, i), num);
            break;
    }
}